

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamStandardIndex::Create(BamStandardIndex *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  uint32_t *currentBin_00;
  ostream *poVar5;
  long in_RDI;
  string message_1;
  string readerError_1;
  BamException *e;
  BaiReferenceEntry emptyEntry_2;
  int i_2;
  stringstream s;
  BaiReferenceEntry emptyEntry_1;
  int i_1;
  BaiReferenceEntry emptyEntry;
  int i;
  BaiReferenceEntry refEntry;
  BamAlignment al;
  int32_t lastPosition;
  uint64_t lastOffset;
  uint64_t currentOffset;
  int32_t lastRefID;
  int32_t currentRefID;
  uint32_t lastBin;
  uint32_t currentBin;
  uint32_t defaultValue;
  int *numReferences;
  string indexFilename;
  string message;
  string readerError;
  BamReaderPrivate *in_stack_fffffffffffff848;
  allocator *paVar6;
  BamAlignment *in_stack_fffffffffffff850;
  undefined8 in_stack_fffffffffffff868;
  BamAlignment *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  int *alignmentStopPosition;
  BamStandardIndex *in_stack_fffffffffffff880;
  int *alignmentStartPosition;
  undefined4 in_stack_fffffffffffff888;
  BamAlignment *in_stack_fffffffffffff890;
  char *in_stack_fffffffffffff898;
  string *in_stack_fffffffffffff8a0;
  string *in_stack_fffffffffffff8a8;
  BamIndex *in_stack_fffffffffffff8b0;
  BamAlignment *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  uint64_t *in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  BamStandardIndex *in_stack_fffffffffffff900;
  allocator local_6d1;
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [4];
  OpenMode in_stack_fffffffffffff974;
  string *in_stack_fffffffffffff978;
  BamStandardIndex *in_stack_fffffffffffff980;
  int local_618;
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [32];
  int local_5c8;
  int local_5c4;
  string local_5c0 [39];
  undefined1 local_599 [40];
  allocator local_571;
  string local_570 [32];
  stringstream local_550 [16];
  ostream local_540 [460];
  int local_374;
  int local_320;
  undefined4 local_31c;
  int local_318;
  int local_2e0 [48];
  int local_220;
  int local_21c;
  ushort local_218;
  int local_16c;
  uint32_t *local_168;
  uint32_t *local_160;
  int local_158;
  int local_154;
  uint local_150;
  uint local_14c;
  undefined4 local_148;
  int local_144;
  int *local_140;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [47];
  byte local_1;
  
  if ((*(long *)(in_RDI + 8) == 0) ||
     (bVar1 = BamReaderPrivate::IsOpen((BamReaderPrivate *)0x1b58a7), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"BamStandardIndex::Create",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"could not create index: reader is not open",&local_69);
    BamIndex::SetErrorString
              (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_1 = 0;
  }
  else {
    bVar1 = BamReaderPrivate::Rewind
                      ((BamReaderPrivate *)
                       CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    if (bVar1) {
      BamReaderPrivate::Filename_abi_cxx11_(in_stack_fffffffffffff848);
      Extension_abi_cxx11_();
      std::operator+(in_stack_fffffffffffff878,&in_stack_fffffffffffff870->Name);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_118);
      OpenFile(in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff974);
      iVar3 = BamReaderPrivate::GetReferenceCount((BamReaderPrivate *)0x1b5be2);
      local_140 = &local_144;
      local_144 = iVar3;
      ReserveForSummary(in_stack_fffffffffffff880,(int *)in_stack_fffffffffffff878);
      WriteHeader((BamStandardIndex *)in_stack_fffffffffffff8d0);
      local_148 = 0xffffffff;
      local_14c = 0xffffffff;
      local_150 = 0xffffffff;
      local_154 = -1;
      local_158 = -1;
      currentBin_00 = (uint32_t *)BamReaderPrivate::Tell((BamReaderPrivate *)0x1b5c77);
      local_16c = -1;
      local_168 = currentBin_00;
      local_160 = currentBin_00;
      BamAlignment::BamAlignment(in_stack_fffffffffffff890);
      local_31c = 0xffffffff;
      BaiReferenceEntry::BaiReferenceEntry
                ((BaiReferenceEntry *)in_stack_fffffffffffff850,(int32_t *)in_stack_fffffffffffff848
                );
      while (uVar2 = BamReaderPrivate::LoadNextAlignment
                               ((BamReaderPrivate *)
                                CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                                in_stack_fffffffffffff8d0), (bool)uVar2) {
        if (local_158 == local_220) {
          if (local_21c < local_16c) {
            paVar6 = &local_571;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_570,"",paVar6);
            _Var4 = std::operator|(_S_out,_S_in);
            std::__cxx11::stringstream::stringstream(local_550,local_570,_Var4);
            std::__cxx11::string::~string(local_570);
            std::allocator<char>::~allocator((allocator<char> *)&local_571);
            poVar5 = std::operator<<(local_540,"BAM file is not properly sorted by coordinate");
            poVar5 = (ostream *)
                     std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            poVar5 = std::operator<<(poVar5,"Current alignment position: ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_21c);
            in_stack_fffffffffffff8b0 =
                 (BamIndex *)std::operator<<(poVar5," < previous alignment position: ");
            in_stack_fffffffffffff8a8 =
                 (string *)std::ostream::operator<<(in_stack_fffffffffffff8b0,local_16c);
            in_stack_fffffffffffff8a0 =
                 (string *)
                 std::operator<<((ostream *)in_stack_fffffffffffff8a8," on reference ID: ");
            in_stack_fffffffffffff898 =
                 (char *)std::ostream::operator<<(in_stack_fffffffffffff8a0,local_220);
            std::ostream::operator<<
                      (in_stack_fffffffffffff898,std::endl<char,std::char_traits<char>>);
            in_stack_fffffffffffff890 = (BamAlignment *)local_599;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_599 + 1),"BamStandardIndex::Create",
                       (allocator *)in_stack_fffffffffffff890);
            std::__cxx11::stringstream::str();
            BamIndex::SetErrorString
                      (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0
                      );
            std::__cxx11::string::~string(local_5c0);
            std::__cxx11::string::~string((string *)(local_599 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_599);
            local_1 = 0;
            local_5c4 = 1;
            std::__cxx11::stringstream::~stringstream(local_550);
            goto LAB_001b668c;
          }
        }
        else {
          if (local_158 == -1) {
            for (local_374 = 0; local_374 < local_220; local_374 = local_374 + 1) {
              BaiReferenceEntry::BaiReferenceEntry
                        ((BaiReferenceEntry *)in_stack_fffffffffffff850,
                         (int32_t *)in_stack_fffffffffffff848);
              WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff850,
                                  (BaiReferenceEntry *)in_stack_fffffffffffff848);
              BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)in_stack_fffffffffffff850);
            }
          }
          else {
            SaveAlignmentChunkToBin
                      (in_stack_fffffffffffff900,
                       (BaiBinMap *)CONCAT44(iVar3,in_stack_fffffffffffff8f8),currentBin_00,
                       (uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffff8e8),
                       in_stack_fffffffffffff8e0);
            WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff850,
                                (BaiReferenceEntry *)in_stack_fffffffffffff848);
            ClearReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff850,
                                (BaiReferenceEntry *)in_stack_fffffffffffff848);
            local_320 = local_158;
            while (local_320 = local_320 + 1, local_320 < local_220) {
              BaiReferenceEntry::BaiReferenceEntry
                        ((BaiReferenceEntry *)in_stack_fffffffffffff850,
                         (int32_t *)in_stack_fffffffffffff848);
              WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff850,
                                  (BaiReferenceEntry *)in_stack_fffffffffffff848);
              BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)in_stack_fffffffffffff850);
            }
            local_160 = local_168;
            local_14c = (uint)local_218;
            local_154 = local_220;
          }
          local_318 = local_220;
          local_158 = local_220;
          local_150 = 0xffffffff;
        }
        if ((-1 < local_220) && (local_218 < 0x1249)) {
          alignmentStopPosition = local_2e0;
          alignmentStartPosition = &local_21c;
          local_5c8 = BamAlignment::GetEndPosition
                                (in_stack_fffffffffffff870,
                                 SUB81((ulong)in_stack_fffffffffffff868 >> 0x38,0),
                                 SUB81((ulong)in_stack_fffffffffffff868 >> 0x30,0));
          SaveLinearOffsetEntry
                    ((BamStandardIndex *)in_stack_fffffffffffff890,
                     (BaiLinearOffsetVector *)CONCAT44(local_5c8,in_stack_fffffffffffff888),
                     alignmentStartPosition,alignmentStopPosition,
                     (uint64_t *)in_stack_fffffffffffff870);
        }
        if (local_218 != local_150) {
          if (local_14c != 0xffffffff) {
            SaveAlignmentChunkToBin
                      (in_stack_fffffffffffff900,
                       (BaiBinMap *)CONCAT44(iVar3,in_stack_fffffffffffff8f8),currentBin_00,
                       (uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffff8e8),
                       in_stack_fffffffffffff8e0);
          }
          local_160 = local_168;
          local_14c = (uint)local_218;
          local_150 = (uint)local_218;
          local_154 = local_220;
          if (local_220 < 0) break;
        }
        in_stack_fffffffffffff870 =
             (BamAlignment *)BamReaderPrivate::Tell((BamReaderPrivate *)0x1b6402);
        if ((long)in_stack_fffffffffffff870 <= (long)local_168) {
          paVar6 = &local_5e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5e8,"BamStandardIndex::Create",paVar6);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_610,"calculating offsets failed",&local_611);
          BamIndex::SetErrorString
                    (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
          std::__cxx11::string::~string(local_610);
          std::allocator<char>::~allocator((allocator<char> *)&local_611);
          std::__cxx11::string::~string(local_5e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
          local_1 = 0;
          local_5c4 = 1;
          goto LAB_001b668c;
        }
        local_168 = (uint32_t *)BamReaderPrivate::Tell((BamReaderPrivate *)0x1b656b);
        local_16c = local_21c;
      }
      local_618 = local_154;
      if (local_168 != local_160) {
        SaveAlignmentChunkToBin
                  (in_stack_fffffffffffff900,(BaiBinMap *)CONCAT44(iVar3,in_stack_fffffffffffff8f8),
                   currentBin_00,(uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffff8e8),
                   in_stack_fffffffffffff8e0);
        WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff850,
                            (BaiReferenceEntry *)in_stack_fffffffffffff848);
        local_618 = local_154;
      }
      while (local_618 = local_618 + 1, local_618 < *local_140) {
        BaiReferenceEntry::BaiReferenceEntry
                  ((BaiReferenceEntry *)in_stack_fffffffffffff850,
                   (int32_t *)in_stack_fffffffffffff848);
        WriteReferenceEntry((BamStandardIndex *)in_stack_fffffffffffff850,
                            (BaiReferenceEntry *)in_stack_fffffffffffff848);
        BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)in_stack_fffffffffffff850);
      }
      local_5c4 = 0;
LAB_001b668c:
      BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)in_stack_fffffffffffff850);
      BamAlignment::~BamAlignment(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(local_f8);
      if (local_5c4 == 0) {
        bVar1 = BamReaderPrivate::Rewind
                          ((BamReaderPrivate *)CONCAT44(iVar3,in_stack_fffffffffffff8f8));
        if (bVar1) {
          local_1 = 1;
        }
        else {
          BamReaderPrivate::GetErrorString_abi_cxx11_(in_stack_fffffffffffff848);
          std::operator+(in_stack_fffffffffffff898,&in_stack_fffffffffffff890->Name);
          paVar6 = &local_6d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_6d0,"BamStandardIndex::Create",paVar6);
          BamIndex::SetErrorString
                    (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
          std::__cxx11::string::~string(local_6d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
          local_1 = 0;
          local_5c4 = 1;
          std::__cxx11::string::~string(local_6b0);
          std::__cxx11::string::~string(local_690);
        }
      }
    }
    else {
      BamReaderPrivate::GetErrorString_abi_cxx11_(in_stack_fffffffffffff848);
      std::operator+(in_stack_fffffffffffff898,&in_stack_fffffffffffff890->Name);
      paVar6 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"BamStandardIndex::Create",paVar6);
      BamIndex::SetErrorString
                (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      local_1 = 0;
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_90);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamStandardIndex::Create(void) {

    // skip if BamReader is invalid or not open
    if ( m_reader == 0 || !m_reader->IsOpen() ) {
        SetErrorString("BamStandardIndex::Create", "could not create index: reader is not open");
        return false;
    }

    // rewind BamReader
    if ( !m_reader->Rewind() ) {
        const string readerError = m_reader->GetErrorString();
        const string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    try {

        // open new index file (read & write)
        string indexFilename = m_reader->Filename() + Extension();
        OpenFile(indexFilename, IBamIODevice::ReadWrite);

        // initialize BaiFileSummary with number of references
        const int& numReferences = m_reader->GetReferenceCount();
        ReserveForSummary(numReferences);

        // initialize output file
        WriteHeader();

        // set up bin, ID, offset, & coordinate markers
        const uint32_t defaultValue = 0xffffffffu;
        uint32_t currentBin    = defaultValue;
        uint32_t lastBin       = defaultValue;
        int32_t  currentRefID  = defaultValue;
        int32_t  lastRefID     = defaultValue;
        uint64_t currentOffset = (uint64_t)m_reader->Tell();
        uint64_t lastOffset    = currentOffset;
        int32_t  lastPosition  = defaultValue;

        // iterate through alignments in BAM file
        BamAlignment al;
        BaiReferenceEntry refEntry;
        while ( m_reader->LoadNextAlignment(al) ) {

            // changed to new reference
            if ( lastRefID != al.RefID ) {

                // if not first reference, save previous reference data
                if ( lastRefID != (int32_t)defaultValue ) {

                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
                    WriteReferenceEntry(refEntry);
                    ClearReferenceEntry(refEntry);

                    // write any empty references between (but *NOT* including) lastRefID & al.RefID
                    for ( int i = lastRefID+1; i < al.RefID; ++i ) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }

                    // update bin markers
                    currentOffset = lastOffset;
                    currentBin    = al.Bin;
                    lastBin       = al.Bin;
                    currentRefID  = al.RefID;
                }

                // otherwise, this is first pass
                // be sure to write any empty references up to (but *NOT* including) current RefID
                else {
                    for ( int i = 0; i < al.RefID; ++i ) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }
                }

                // update reference markers
                refEntry.ID = al.RefID;
                lastRefID   = al.RefID;
                lastBin     = defaultValue;
            }

            // if lastPosition greater than current alignment position - file not sorted properly
            else if ( lastPosition > al.Position ) {
                stringstream s("");
                s << "BAM file is not properly sorted by coordinate" << endl
                  << "Current alignment position: " << al.Position
                  << " < previous alignment position: " << lastPosition
                  << " on reference ID: " << al.RefID << endl;
                SetErrorString("BamStandardIndex::Create", s.str());
                return false;
            }

            // if alignment's ref ID is valid & its bin is not a 'leaf'
            if ( (al.RefID >= 0) && (al.Bin < 4681) )
                SaveLinearOffsetEntry(refEntry.LinearOffsets, al.Position, al.GetEndPosition(), lastOffset);

            // changed to new BAI bin
            if ( al.Bin != lastBin ) {

                // if not first bin on reference, save previous bin data
                if ( currentBin != defaultValue )
                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);

                // update markers
                currentOffset = lastOffset;
                currentBin    = al.Bin;
                lastBin       = al.Bin;
                currentRefID  = al.RefID;

                // if invalid RefID, break out
                if ( currentRefID < 0 )
                    break;
            }

            // make sure that current file pointer is beyond lastOffset
            if ( m_reader->Tell() <= (int64_t)lastOffset ) {
                SetErrorString("BamStandardIndex::Create", "calculating offsets failed");
                return false;
            }

            // update lastOffset & lastPosition
            lastOffset   = m_reader->Tell();
            lastPosition = al.Position;
        }

        // after finishing alignments, if any data was read, check:
        if ( lastOffset != currentOffset ) {

            // store last alignment chunk to its bin, then write last reference entry with data
            SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
            WriteReferenceEntry(refEntry);
        }

        // then write any empty references remaining at end of file
        for ( int i = currentRefID+1; i < numReferences; ++i ) {
            BaiReferenceEntry emptyEntry(i);
            WriteReferenceEntry(emptyEntry);
        }

    } catch ( BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // rewind BamReader
    if ( !m_reader->Rewind() ) {
        const string readerError = m_reader->GetErrorString();
        const string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    // return success
    return true;
}